

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_getimage.c
# Opt level: O0

void putcontig8bitCIELab16
               (TIFFRGBAImage *img,uint32_t *cp,uint32_t x,uint32_t y,uint32_t w,uint32_t h,
               int32_t fromskew,int32_t toskew,uchar *pp)

{
  ushort *local_48;
  uint16_t *wp;
  uint32_t b;
  uint32_t g;
  uint32_t r;
  float Z;
  float Y;
  float X;
  uint32_t h_local;
  uint32_t w_local;
  uint32_t y_local;
  uint32_t x_local;
  uint32_t *cp_local;
  TIFFRGBAImage *img_local;
  
  local_48 = (ushort *)pp;
  X = (float)w;
  h_local = y;
  _y_local = cp;
  cp_local = (uint32_t *)img;
  for (Y = (float)h; Y != 0.0; Y = (float)((int)Y + -1)) {
    for (w_local = (uint32_t)X; w_local != 0; w_local = w_local - 1) {
      TIFFCIELab16ToXYZ(*(TIFFCIELabToRGB **)(cp_local + 0x1c),(uint)*local_48,
                        (int)(short)local_48[1],(int)(short)local_48[2],&Z,(float *)&r,(float *)&g);
      TIFFXYZToRGB(*(TIFFCIELabToRGB **)(cp_local + 0x1c),Z,(float)r,(float)g,&b,
                   (uint32_t *)((long)&wp + 4),(uint32_t *)&wp);
      *_y_local = b | wp._4_4_ << 8 | (int)wp << 0x10 | 0xff000000;
      local_48 = local_48 + 3;
      _y_local = _y_local + 1;
    }
    _y_local = _y_local + toskew;
    local_48 = local_48 + fromskew * 3;
  }
  return;
}

Assistant:

DECLAREContigPutFunc(putcontig8bitCIELab16)
{
    float X, Y, Z;
    uint32_t r, g, b;
    uint16_t *wp = (uint16_t *)pp;
    (void)y;
    fromskew *= 3;
    for (; h > 0; --h)
    {
        for (x = w; x > 0; --x)
        {
            TIFFCIELab16ToXYZ(img->cielab, (uint16_t)wp[0], (int16_t)wp[1],
                              (int16_t)wp[2], &X, &Y, &Z);
            TIFFXYZToRGB(img->cielab, X, Y, Z, &r, &g, &b);
            *cp++ = PACK(r, g, b);
            wp += 3;
        }
        cp += toskew;
        wp += fromskew;
    }
}